

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id_set_lexicon.cc
# Opt level: O2

int32 __thiscall
IdSetLexicon::AddInternal(IdSetLexicon *this,vector<int,_std::allocator<int>_> *ids)

{
  uint *puVar1;
  uint *puVar2;
  uint32 uVar3;
  uint uVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  
  puVar1 = (uint *)(ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
  puVar2 = (uint *)(ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
  if (puVar1 == puVar2) {
    uVar4 = 0x80000000;
  }
  else if ((long)puVar2 - (long)puVar1 == 4) {
    uVar4 = *puVar1;
  }
  else {
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ();
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        ((ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start,
                         (ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish);
    std::vector<int,_std::allocator<int>_>::erase
              (ids,(const_iterator)__first._M_current,
               (const_iterator)
               (ids->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_finish);
    uVar3 = SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::
            Add<std::vector<int,std::allocator<int>>>
                      ((SequenceLexicon<int,std::hash<int>,std::equal_to<int>> *)this,ids);
    uVar4 = ~uVar3;
  }
  return uVar4;
}

Assistant:

int32 IdSetLexicon::AddInternal(std::vector<int32>* ids) {
  if (ids->empty()) {
    // Empty sets have a special id chosen not to conflict with other ids.
    return kEmptySetId;
  } else if (ids->size() == 1) {
    // Singleton sets are represented by their element.
    return (*ids)[0];
  } else {
    // Canonicalize the set by sorting and removing duplicates.
    std::sort(ids->begin(), ids->end());
    ids->erase(std::unique(ids->begin(), ids->end()), ids->end());
    // Non-singleton sets are represented by the bitwise complement of the id
    // returned by SequenceLexicon.
    return ~id_sets_.Add(*ids);
  }
}